

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDepsHelper
          (DescriptorBuilder *this,DescriptorPool *pool,string *name,bool build_it)

{
  bool bVar1;
  Tables *pTVar2;
  Symbol SVar3;
  Mutex *local_80;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  MutexLockMaybe local_40;
  MutexLockMaybe lock;
  bool build_it_local;
  string *name_local;
  DescriptorPool *pool_local;
  DescriptorBuilder *this_local;
  Symbol result;
  
  if (pool == this->pool_) {
    local_80 = (Mutex *)0x0;
  }
  else {
    local_80 = pool->mutex_;
  }
  lock.mu_._7_1_ = build_it;
  internal::MutexLockMaybe::MutexLockMaybe(&local_40,local_80);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&pool->tables_);
  SVar3 = DescriptorPool::Tables::FindSymbol(pTVar2,name);
  result._0_8_ = SVar3.field_1;
  this_local = (DescriptorBuilder *)CONCAT44(this_local._4_4_,SVar3.type);
  bVar1 = Symbol::IsNull((Symbol *)&this_local);
  if ((bVar1) && (pool->underlay_ != (DescriptorPool *)0x0)) {
    SVar3 = FindSymbolNotEnforcingDepsHelper(this,pool->underlay_,name,true);
    result._0_8_ = SVar3.field_1;
    this_local = (DescriptorBuilder *)CONCAT44(uStack_5c,SVar3.type);
  }
  bVar1 = Symbol::IsNull((Symbol *)&this_local);
  if (((bVar1) && ((lock.mu_._7_1_ & 1) != 0)) &&
     (bVar1 = DescriptorPool::TryFindSymbolInFallbackDatabase(pool,name), bVar1)) {
    pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                       (&pool->tables_);
    SVar3 = DescriptorPool::Tables::FindSymbol(pTVar2,name);
    result._0_8_ = SVar3.field_1;
    this_local = (DescriptorBuilder *)CONCAT44(uStack_6c,SVar3.type);
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&local_40);
  SVar3._0_8_ = (ulong)this_local & 0xffffffff;
  SVar3.field_1 = (anon_union_8_8_13f84498_for_Symbol_2)result._0_8_;
  return SVar3;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDepsHelper(
    const DescriptorPool* pool, const string& name, bool build_it) {
  // If we are looking at an underlay, we must lock its mutex_, since we are
  // accessing the underlay's tables_ directly.
  MutexLockMaybe lock((pool == pool_) ? NULL : pool->mutex_);

  Symbol result = pool->tables_->FindSymbol(name);
  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result = FindSymbolNotEnforcingDepsHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // With lazily_build_dependencies_, a symbol lookup at cross link time is
    // not guaranteed to be successful. In most cases, build_it will be false,
    // which intentionally prevents us from building an import until it's
    // actually needed. In some cases, like registering an extension, we want
    // to build the file containing the symbol, and build_it will be set.
    // Also, build_it will be true when !lazily_build_dependencies_, to provide
    // better error reporting of missing dependencies.
    if (build_it && pool->TryFindSymbolInFallbackDatabase(name)) {
      result = pool->tables_->FindSymbol(name);
    }
  }

  return result;
}